

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dchClass.c
# Opt level: O1

int Dch_ClassesRefineOneClass(Dch_Cla_t *p,Aig_Obj_t *pReprOld,int fRecursive)

{
  uint uVar1;
  int iVar2;
  Aig_Obj_t *pAVar3;
  Aig_Obj_t **ppAVar4;
  Aig_Obj_t *pAVar5;
  Aig_Obj_t **ppAVar6;
  int iVar7;
  void **ppvVar8;
  long lVar9;
  Vec_Ptr_t *pVVar10;
  Aig_Obj_t *pAVar11;
  long lVar12;
  int local_38;
  int local_34;
  
  local_38 = 0;
  local_34 = fRecursive;
  do {
    p->vClassOld->nSize = 0;
    p->vClassNew->nSize = 0;
    lVar9 = (long)pReprOld->Id;
    if (0 < p->pClassSizes[lVar9]) {
      lVar12 = 0;
      do {
        pAVar3 = p->pId2Class[lVar9][lVar12];
        if (pAVar3 != (Aig_Obj_t *)0x0) {
          iVar7 = (*p->pFuncNodesAreEqual)(p->pManData,pReprOld,pAVar3);
          if (iVar7 == 0) {
            pVVar10 = p->vClassNew;
          }
          else {
            pVVar10 = p->vClassOld;
          }
          uVar1 = pVVar10->nCap;
          if (pVVar10->nSize == uVar1) {
            if ((int)uVar1 < 0x10) {
              if (pVVar10->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc(0x80);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar10->pArray,0x80);
              }
              pVVar10->pArray = ppvVar8;
              iVar7 = 0x10;
            }
            else {
              iVar7 = uVar1 * 2;
              if (iVar7 <= (int)uVar1) goto LAB_005e359c;
              if (pVVar10->pArray == (void **)0x0) {
                ppvVar8 = (void **)malloc((ulong)uVar1 << 4);
              }
              else {
                ppvVar8 = (void **)realloc(pVVar10->pArray,(ulong)uVar1 << 4);
              }
              pVVar10->pArray = ppvVar8;
            }
            pVVar10->nCap = iVar7;
          }
LAB_005e359c:
          iVar7 = pVVar10->nSize;
          pVVar10->nSize = iVar7 + 1;
          pVVar10->pArray[iVar7] = pAVar3;
        }
        lVar12 = lVar12 + 1;
        lVar9 = (long)pReprOld->Id;
      } while (lVar12 < p->pClassSizes[lVar9]);
    }
    iVar7 = p->vClassNew->nSize;
    if (iVar7 == 0) {
      iVar7 = 0;
LAB_005e3786:
      return local_38 + iVar7;
    }
    if (iVar7 < 1) {
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    if (p->vClassOld->nSize < 1) {
      __assert_fail("Vec_PtrSize(p->vClassOld) > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                    ,0x1cf,"int Dch_ClassesRefineOneClass(Dch_Cla_t *, Aig_Obj_t *, int)");
    }
    ppAVar4 = p->pId2Class[lVar9];
    if (ppAVar4 == (Aig_Obj_t **)0x0) {
      __assert_fail("pClass != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                    ,0x74,"Aig_Obj_t **Dch_ObjRemoveClass(Dch_Cla_t *, Aig_Obj_t *)");
    }
    pAVar3 = (Aig_Obj_t *)*p->vClassNew->pArray;
    p->pId2Class[lVar9] = (Aig_Obj_t **)0x0;
    iVar7 = p->pClassSizes[lVar9];
    if (iVar7 < 2) {
      __assert_fail("nSize > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                    ,0x77,"Aig_Obj_t **Dch_ObjRemoveClass(Dch_Cla_t *, Aig_Obj_t *)");
    }
    p->nClasses = p->nClasses + -1;
    p->nLits = (p->nLits - iVar7) + 1;
    p->pClassSizes[lVar9] = 0;
    pVVar10 = p->vClassOld;
    if (pVVar10->nSize < 1) {
      lVar9 = 0;
    }
    else {
      lVar9 = 0;
      do {
        pAVar5 = (Aig_Obj_t *)pVVar10->pArray[lVar9];
        ppAVar4[lVar9] = pAVar5;
        ppAVar6 = p->pAig->pReprs;
        if (ppAVar6 == (Aig_Obj_t **)0x0) goto LAB_005e379a;
        pAVar11 = pReprOld;
        if (lVar9 == 0) {
          pAVar11 = (Aig_Obj_t *)0x0;
        }
        ppAVar6[pAVar5->Id] = pAVar11;
        lVar9 = lVar9 + 1;
        pVVar10 = p->vClassOld;
      } while (lVar9 < pVVar10->nSize);
    }
    pVVar10 = p->vClassNew;
    if (0 < pVVar10->nSize) {
      lVar12 = 0;
      do {
        pAVar5 = (Aig_Obj_t *)pVVar10->pArray[lVar12];
        (ppAVar4 + lVar9)[lVar12] = pAVar5;
        ppAVar6 = p->pAig->pReprs;
        if (ppAVar6 == (Aig_Obj_t **)0x0) {
LAB_005e379a:
          __assert_fail("p->pReprs",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                        ,0x14b,"void Aig_ObjSetRepr(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
        }
        pAVar11 = pAVar3;
        if (lVar12 == 0) {
          pAVar11 = (Aig_Obj_t *)0x0;
        }
        ppAVar6[pAVar5->Id] = pAVar11;
        lVar12 = lVar12 + 1;
        pVVar10 = p->vClassNew;
      } while (lVar12 < pVVar10->nSize);
    }
    iVar7 = p->vClassOld->nSize;
    if (1 < iVar7) {
      iVar2 = pReprOld->Id;
      if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) goto LAB_005e3835;
      p->pId2Class[iVar2] = ppAVar4;
      if (p->pClassSizes[iVar2] != 0) goto LAB_005e3854;
      p->pClassSizes[iVar2] = iVar7;
      p->nClasses = p->nClasses + 1;
      p->nLits = p->nLits + iVar7 + -1;
    }
    iVar7 = p->vClassNew->nSize;
    if (1 < iVar7) {
      iVar2 = pAVar3->Id;
      if (p->pId2Class[iVar2] != (Aig_Obj_t **)0x0) {
LAB_005e3835:
        __assert_fail("p->pId2Class[pRepr->Id] == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                      ,0x5c,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      p->pId2Class[iVar2] = ppAVar4 + lVar9;
      if (p->pClassSizes[iVar2] != 0) {
LAB_005e3854:
        __assert_fail("p->pClassSizes[pRepr->Id] == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/dch/dchClass.c"
                      ,0x5e,"void Dch_ObjAddClass(Dch_Cla_t *, Aig_Obj_t *, Aig_Obj_t **, int)");
      }
      p->pClassSizes[iVar2] = iVar7;
      p->nClasses = p->nClasses + 1;
      p->nLits = iVar7 + p->nLits + -1;
    }
    iVar7 = 1;
    if ((local_34 == 0) || (p->vClassNew->nSize < 2)) goto LAB_005e3786;
    local_38 = local_38 + 1;
    local_34 = 1;
    pReprOld = pAVar3;
  } while( true );
}

Assistant:

int Dch_ClassesRefineOneClass( Dch_Cla_t * p, Aig_Obj_t * pReprOld, int fRecursive )
{
    Aig_Obj_t ** pClassOld, ** pClassNew;
    Aig_Obj_t * pObj, * pReprNew;
    int i;

    // split the class
    Vec_PtrClear( p->vClassOld );
    Vec_PtrClear( p->vClassNew );
    Dch_ClassForEachNode( p, pReprOld, pObj, i )
        if ( p->pFuncNodesAreEqual(p->pManData, pReprOld, pObj) )
            Vec_PtrPush( p->vClassOld, pObj );
        else
            Vec_PtrPush( p->vClassNew, pObj );
    // check if splitting happened
    if ( Vec_PtrSize(p->vClassNew) == 0 )
        return 0;

    // get the new representative
    pReprNew = (Aig_Obj_t *)Vec_PtrEntry( p->vClassNew, 0 );
    assert( Vec_PtrSize(p->vClassOld) > 0 );
    assert( Vec_PtrSize(p->vClassNew) > 0 );

    // create old class
    pClassOld = Dch_ObjRemoveClass( p, pReprOld );
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassOld, pObj, i )
    {
        pClassOld[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprOld : NULL );
    }
    // create new class
    pClassNew = pClassOld + i;
    Vec_PtrForEachEntry( Aig_Obj_t *, p->vClassNew, pObj, i )
    {
        pClassNew[i] = pObj;
        Aig_ObjSetRepr( p->pAig, pObj, i? pReprNew : NULL );
    }

    // put classes back
    if ( Vec_PtrSize(p->vClassOld) > 1 )
        Dch_ObjAddClass( p, pReprOld, pClassOld, Vec_PtrSize(p->vClassOld) );
    if ( Vec_PtrSize(p->vClassNew) > 1 )
        Dch_ObjAddClass( p, pReprNew, pClassNew, Vec_PtrSize(p->vClassNew) );

    // check if the class should be recursively refined
    if ( fRecursive && Vec_PtrSize(p->vClassNew) > 1 )
        return 1 + Dch_ClassesRefineOneClass( p, pReprNew, 1 );
    return 1;
}